

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

int preg_of(dill_stream c,basic_block_conflict bb,int vreg)

{
  int vreg_local;
  basic_block_conflict bb_local;
  dill_stream c_local;
  int local_4;
  
  if (vreg < 100) {
    if (c->p->c_param_args[vreg].is_register == '\0') {
      local_4 = -1;
    }
    else {
      local_4 = c->p->c_param_args[vreg].in_reg;
    }
  }
  else if (bb->reg_assigns[vreg + -100] == -1) {
    local_4 = c->p->vregs[vreg + -100].preg;
  }
  else {
    local_4 = (int)bb->reg_assigns[vreg + -100];
  }
  return local_4;
}

Assistant:

static int
preg_of(dill_stream c, basic_block bb, int vreg)
{
    if (vreg >= 100) {
        if (bb->reg_assigns[vreg - 100] == -1) {
            return c->p->vregs[vreg - 100].preg;
        } else {
            return bb->reg_assigns[vreg - 100];
        }
    } else {
        /* parameter */;
        if (c->p->c_param_args[vreg].is_register) {
            return c->p->c_param_args[vreg].in_reg;
        }
        return -1;
    }
}